

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

JsonArrayWriter * __thiscall
Catch::JsonArrayWriter::writeImpl<bool>(JsonArrayWriter *this,bool *value)

{
  char *pcVar1;
  StringRef value_00;
  undefined1 local_1b0 [400];
  uint64_t local_20;
  
  JsonUtils::appendCommaNewline(this->m_os,&this->m_should_comma,this->m_indent_level + 1);
  local_1b0._0_8_ = this->m_os;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
  local_20 = 0;
  pcVar1 = "false";
  if ((ulong)*value != 0) {
    pcVar1 = "true";
  }
  value_00.m_size = (ulong)*value ^ 5;
  value_00.m_start = pcVar1;
  JsonValueWriter::writeImpl((JsonValueWriter *)local_1b0,value_00,false);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x88));
  return this;
}

Assistant:

JsonArrayWriter& writeImpl( T const& value ) {
            JsonUtils::appendCommaNewline(
                m_os, m_should_comma, m_indent_level + 1 );
            JsonValueWriter{ m_os }.write( value );

            return *this;
        }